

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined4 uVar25;
  int iVar26;
  long lVar27;
  RTCRayN *pRVar28;
  ulong uVar29;
  ulong uVar30;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar31;
  ulong uVar32;
  NodeRef *pNVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  float fVar39;
  uint uVar40;
  float fVar43;
  float fVar46;
  vint4 bi;
  uint uVar44;
  float fVar45;
  uint uVar47;
  float fVar48;
  float fVar49;
  uint uVar50;
  float fVar51;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar52;
  uint uVar53;
  uint uVar54;
  float fVar57;
  float fVar61;
  vint4 ai;
  uint uVar58;
  uint uVar59;
  float fVar60;
  uint uVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  uint uVar66;
  uint uVar67;
  float fVar68;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  float fVar72;
  vint4 ai_1;
  uint uVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  NodeRef *pNStack_a90;
  undefined1 local_9c8 [16];
  Geometry *local_9b8;
  ulong local_9b0;
  Scene *local_9a8;
  ulong local_9a0;
  ulong local_998;
  undefined1 (*local_990) [16];
  NodeRef *local_988;
  ulong local_980;
  RTCFilterFunctionNArguments args;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_998 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_9a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar32 = local_998 ^ 0x10;
  uVar36 = local_9a0 ^ 0x10;
  iVar12 = (tray->tnear).field_0.i[k];
  iVar13 = (tray->tfar).field_0.i[k];
  local_990 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar33 = stack + 1;
  do {
    local_988 = pNVar33;
    if (local_988 == stack) break;
    pNVar33 = local_988 + -1;
    sVar35 = local_988[-1].ptr;
    pNStack_a90 = local_988;
    do {
      if ((sVar35 & 8) == 0) {
        pfVar4 = (float *)(sVar35 + 0x20 + local_998);
        fVar39 = (*pfVar4 - fVar6) * fVar9;
        fVar43 = (pfVar4[1] - fVar6) * fVar9;
        fVar46 = (pfVar4[2] - fVar6) * fVar9;
        fVar49 = (pfVar4[3] - fVar6) * fVar9;
        pfVar4 = (float *)(sVar35 + 0x20 + local_9a0);
        fVar52 = (*pfVar4 - fVar7) * fVar10;
        fVar57 = (pfVar4[1] - fVar7) * fVar10;
        fVar61 = (pfVar4[2] - fVar7) * fVar10;
        fVar65 = (pfVar4[3] - fVar7) * fVar10;
        uVar53 = (uint)((int)fVar52 < (int)fVar39) * (int)fVar39 |
                 (uint)((int)fVar52 >= (int)fVar39) * (int)fVar52;
        uVar58 = (uint)((int)fVar57 < (int)fVar43) * (int)fVar43 |
                 (uint)((int)fVar57 >= (int)fVar43) * (int)fVar57;
        uVar62 = (uint)((int)fVar61 < (int)fVar46) * (int)fVar46 |
                 (uint)((int)fVar61 >= (int)fVar46) * (int)fVar61;
        uVar66 = (uint)((int)fVar65 < (int)fVar49) * (int)fVar49 |
                 (uint)((int)fVar65 >= (int)fVar49) * (int)fVar65;
        pfVar4 = (float *)(sVar35 + 0x20 + uVar31);
        fVar39 = (*pfVar4 - fVar8) * fVar11;
        fVar43 = (pfVar4[1] - fVar8) * fVar11;
        fVar46 = (pfVar4[2] - fVar8) * fVar11;
        fVar49 = (pfVar4[3] - fVar8) * fVar11;
        uVar40 = (uint)((int)fVar39 < iVar12) * iVar12 | (uint)((int)fVar39 >= iVar12) * (int)fVar39
        ;
        uVar44 = (uint)((int)fVar43 < iVar12) * iVar12 | (uint)((int)fVar43 >= iVar12) * (int)fVar43
        ;
        uVar47 = (uint)((int)fVar46 < iVar12) * iVar12 | (uint)((int)fVar46 >= iVar12) * (int)fVar46
        ;
        uVar50 = (uint)((int)fVar49 < iVar12) * iVar12 | (uint)((int)fVar49 >= iVar12) * (int)fVar49
        ;
        pfVar4 = (float *)(sVar35 + 0x20 + uVar32);
        fVar39 = (*pfVar4 - fVar6) * fVar9;
        fVar43 = (pfVar4[1] - fVar6) * fVar9;
        fVar46 = (pfVar4[2] - fVar6) * fVar9;
        fVar49 = (pfVar4[3] - fVar6) * fVar9;
        pfVar4 = (float *)(sVar35 + 0x20 + uVar36);
        fVar52 = (*pfVar4 - fVar7) * fVar10;
        fVar57 = (pfVar4[1] - fVar7) * fVar10;
        fVar61 = (pfVar4[2] - fVar7) * fVar10;
        fVar65 = (pfVar4[3] - fVar7) * fVar10;
        uVar69 = (uint)((int)fVar39 < (int)fVar52) * (int)fVar39 |
                 (uint)((int)fVar39 >= (int)fVar52) * (int)fVar52;
        uVar70 = (uint)((int)fVar43 < (int)fVar57) * (int)fVar43 |
                 (uint)((int)fVar43 >= (int)fVar57) * (int)fVar57;
        uVar71 = (uint)((int)fVar46 < (int)fVar61) * (int)fVar46 |
                 (uint)((int)fVar46 >= (int)fVar61) * (int)fVar61;
        uVar73 = (uint)((int)fVar49 < (int)fVar65) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar65) * (int)fVar65;
        pfVar4 = (float *)(sVar35 + 0x20 + (uVar31 ^ 0x10));
        fVar39 = (*pfVar4 - fVar8) * fVar11;
        fVar43 = (pfVar4[1] - fVar8) * fVar11;
        fVar46 = (pfVar4[2] - fVar8) * fVar11;
        fVar49 = (pfVar4[3] - fVar8) * fVar11;
        uVar54 = (uint)(iVar13 < (int)fVar39) * iVar13 | (uint)(iVar13 >= (int)fVar39) * (int)fVar39
        ;
        uVar59 = (uint)(iVar13 < (int)fVar43) * iVar13 | (uint)(iVar13 >= (int)fVar43) * (int)fVar43
        ;
        uVar63 = (uint)(iVar13 < (int)fVar46) * iVar13 | (uint)(iVar13 >= (int)fVar46) * (int)fVar46
        ;
        uVar67 = (uint)(iVar13 < (int)fVar49) * iVar13 | (uint)(iVar13 >= (int)fVar49) * (int)fVar49
        ;
        auVar41._0_4_ =
             -(uint)((int)(((int)uVar69 < (int)uVar54) * uVar69 |
                          ((int)uVar69 >= (int)uVar54) * uVar54) <
                    (int)(((int)uVar40 < (int)uVar53) * uVar53 |
                         ((int)uVar40 >= (int)uVar53) * uVar40));
        auVar41._4_4_ =
             -(uint)((int)(((int)uVar70 < (int)uVar59) * uVar70 |
                          ((int)uVar70 >= (int)uVar59) * uVar59) <
                    (int)(((int)uVar44 < (int)uVar58) * uVar58 |
                         ((int)uVar44 >= (int)uVar58) * uVar44));
        auVar41._8_4_ =
             -(uint)((int)(((int)uVar71 < (int)uVar63) * uVar71 |
                          ((int)uVar71 >= (int)uVar63) * uVar63) <
                    (int)(((int)uVar47 < (int)uVar62) * uVar62 |
                         ((int)uVar47 >= (int)uVar62) * uVar47));
        auVar41._12_4_ =
             -(uint)((int)(((int)uVar73 < (int)uVar67) * uVar73 |
                          ((int)uVar73 >= (int)uVar67) * uVar67) <
                    (int)(((int)uVar50 < (int)uVar66) * uVar66 |
                         ((int)uVar50 >= (int)uVar66) * uVar50));
        uVar25 = movmskps((int)pNStack_a90,auVar41);
        unaff_RBP = (ulong)(byte)((byte)uVar25 ^ 0xf);
      }
      if ((sVar35 & 8) == 0) {
        if (unaff_RBP == 0) {
          pNStack_a90 = (NodeRef *)0x4;
        }
        else {
          uVar34 = sVar35 & 0xfffffffffffffff0;
          lVar27 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          sVar35 = *(size_t *)(uVar34 + lVar27 * 8);
          uVar30 = unaff_RBP - 1 & unaff_RBP;
          if (uVar30 != 0) {
            pNVar33->ptr = sVar35;
            lVar27 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            uVar29 = uVar30 - 1;
            while( true ) {
              pNVar33 = pNVar33 + 1;
              sVar35 = *(size_t *)(uVar34 + lVar27 * 8);
              uVar29 = uVar29 & uVar30;
              if (uVar29 == 0) break;
              pNVar33->ptr = sVar35;
              lVar27 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              uVar30 = uVar29 - 1;
            }
          }
          pNStack_a90 = (NodeRef *)0x0;
        }
      }
      else {
        pNStack_a90 = (NodeRef *)0x6;
      }
    } while ((int)pNStack_a90 == 0);
    if ((int)pNStack_a90 == 6) {
      pNStack_a90 = (NodeRef *)0x0;
      local_980 = (ulong)((uint)sVar35 & 0xf) - 8;
      bVar37 = local_980 != 0;
      if (bVar37) {
        uVar34 = sVar35 & 0xfffffffffffffff0;
        uVar30 = 0;
        do {
          lVar27 = uVar30 * 0x50;
          local_9a8 = context->scene;
          ppfVar14 = (local_9a8->vertices).items;
          pfVar15 = ppfVar14[*(uint *)(uVar34 + 0x30 + lVar27)];
          pfVar4 = pfVar15 + *(uint *)(uVar34 + lVar27);
          fVar52 = *pfVar4;
          fVar57 = pfVar4[1];
          fVar61 = pfVar4[2];
          pfVar4 = pfVar15 + *(uint *)(uVar34 + 0x10 + lVar27);
          pfVar15 = pfVar15 + *(uint *)(uVar34 + 0x20 + lVar27);
          pfVar16 = ppfVar14[*(uint *)(uVar34 + 0x34 + lVar27)];
          pfVar1 = pfVar16 + *(uint *)(uVar34 + 4 + lVar27);
          fVar65 = *pfVar1;
          fVar60 = pfVar1[1];
          fVar45 = pfVar1[2];
          pfVar1 = pfVar16 + *(uint *)(uVar34 + 0x14 + lVar27);
          pfVar16 = pfVar16 + *(uint *)(uVar34 + 0x24 + lVar27);
          pfVar17 = ppfVar14[*(uint *)(uVar34 + 0x38 + lVar27)];
          pfVar2 = pfVar17 + *(uint *)(uVar34 + 8 + lVar27);
          fVar72 = *pfVar2;
          fVar64 = pfVar2[1];
          fVar48 = pfVar2[2];
          pfVar2 = pfVar17 + *(uint *)(uVar34 + 0x18 + lVar27);
          pfVar17 = pfVar17 + *(uint *)(uVar34 + 0x28 + lVar27);
          pfVar18 = ppfVar14[*(uint *)(uVar34 + 0x3c + lVar27)];
          pfVar3 = pfVar18 + *(uint *)(uVar34 + 0xc + lVar27);
          fVar74 = *pfVar3;
          fVar68 = pfVar3[1];
          fVar51 = pfVar3[2];
          pfVar3 = pfVar18 + *(uint *)(uVar34 + 0x1c + lVar27);
          uVar40 = *(uint *)(uVar34 + 0x2c + lVar27);
          pfVar18 = pfVar18 + uVar40;
          puVar5 = (undefined8 *)(uVar34 + 0x30 + lVar27);
          local_938 = *puVar5;
          uStack_930 = puVar5[1];
          puVar5 = (undefined8 *)(uVar34 + 0x40 + lVar27);
          local_948 = *puVar5;
          uStack_940 = puVar5[1];
          fVar87 = fVar52 - *pfVar4;
          fVar88 = fVar65 - *pfVar1;
          fVar89 = fVar72 - *pfVar2;
          fVar90 = fVar74 - *pfVar3;
          fVar93 = fVar57 - pfVar4[1];
          fVar94 = fVar60 - pfVar1[1];
          fVar95 = fVar64 - pfVar2[1];
          fVar96 = fVar68 - pfVar3[1];
          fVar97 = fVar61 - pfVar4[2];
          fVar99 = fVar45 - pfVar1[2];
          fVar101 = fVar48 - pfVar2[2];
          fVar103 = fVar51 - pfVar3[2];
          fVar79 = *pfVar15 - fVar52;
          fVar80 = *pfVar16 - fVar65;
          fVar81 = *pfVar17 - fVar72;
          fVar82 = *pfVar18 - fVar74;
          fVar83 = pfVar15[1] - fVar57;
          fVar84 = pfVar16[1] - fVar60;
          fVar85 = pfVar17[1] - fVar64;
          fVar86 = pfVar18[1] - fVar68;
          fVar75 = pfVar15[2] - fVar61;
          fVar76 = pfVar16[2] - fVar45;
          fVar77 = pfVar17[2] - fVar48;
          fVar78 = pfVar18[2] - fVar51;
          local_898[0] = fVar97 * fVar83 - fVar93 * fVar75;
          local_898[1] = fVar99 * fVar84 - fVar94 * fVar76;
          local_898[2] = fVar101 * fVar85 - fVar95 * fVar77;
          local_898[3] = fVar103 * fVar86 - fVar96 * fVar78;
          fVar39 = *(float *)(ray + k * 4);
          fVar43 = *(float *)(ray + k * 4 + 0x10);
          fVar46 = *(float *)(ray + k * 4 + 0x40);
          fVar49 = *(float *)(ray + k * 4 + 0x50);
          fVar52 = fVar52 - fVar39;
          fVar65 = fVar65 - fVar39;
          fVar72 = fVar72 - fVar39;
          fVar74 = fVar74 - fVar39;
          fVar57 = fVar57 - fVar43;
          fVar60 = fVar60 - fVar43;
          fVar64 = fVar64 - fVar43;
          fVar68 = fVar68 - fVar43;
          fVar105 = fVar52 * fVar49 - fVar57 * fVar46;
          fVar106 = fVar65 * fVar49 - fVar60 * fVar46;
          fVar107 = fVar72 * fVar49 - fVar64 * fVar46;
          fVar108 = fVar74 * fVar49 - fVar68 * fVar46;
          local_888[0] = fVar87 * fVar75 - fVar97 * fVar79;
          local_888[1] = fVar88 * fVar76 - fVar99 * fVar80;
          local_888[2] = fVar89 * fVar77 - fVar101 * fVar81;
          local_888[3] = fVar90 * fVar78 - fVar103 * fVar82;
          fVar39 = *(float *)(ray + k * 4 + 0x20);
          fVar43 = *(float *)(ray + k * 4 + 0x60);
          fVar61 = fVar61 - fVar39;
          fVar45 = fVar45 - fVar39;
          fVar48 = fVar48 - fVar39;
          fVar51 = fVar51 - fVar39;
          fVar109 = fVar61 * fVar46 - fVar52 * fVar43;
          fVar110 = fVar45 * fVar46 - fVar65 * fVar43;
          fVar111 = fVar48 * fVar46 - fVar72 * fVar43;
          fVar112 = fVar51 * fVar46 - fVar74 * fVar43;
          local_878[0] = fVar93 * fVar79 - fVar87 * fVar83;
          local_878[1] = fVar94 * fVar80 - fVar88 * fVar84;
          local_878[2] = fVar95 * fVar81 - fVar89 * fVar85;
          local_878[3] = fVar96 * fVar82 - fVar90 * fVar86;
          fVar98 = fVar57 * fVar43 - fVar61 * fVar49;
          fVar100 = fVar60 * fVar43 - fVar45 * fVar49;
          fVar102 = fVar64 * fVar43 - fVar48 * fVar49;
          fVar104 = fVar68 * fVar43 - fVar51 * fVar49;
          fVar39 = fVar46 * local_898[0] + fVar49 * local_888[0] + fVar43 * local_878[0];
          fVar91 = fVar46 * local_898[1] + fVar49 * local_888[1] + fVar43 * local_878[1];
          fVar92 = fVar46 * local_898[2] + fVar49 * local_888[2] + fVar43 * local_878[2];
          fVar43 = fVar46 * local_898[3] + fVar49 * local_888[3] + fVar43 * local_878[3];
          uVar44 = (uint)fVar39 & 0x80000000;
          uVar47 = (uint)fVar91 & 0x80000000;
          uVar50 = (uint)fVar92 & 0x80000000;
          uVar53 = (uint)fVar43 & 0x80000000;
          local_928 = (float)((uint)(fVar79 * fVar98 + fVar83 * fVar109 + fVar75 * fVar105) ^ uVar44
                             );
          fStack_924 = (float)((uint)(fVar80 * fVar100 + fVar84 * fVar110 + fVar76 * fVar106) ^
                              uVar47);
          fStack_920 = (float)((uint)(fVar81 * fVar102 + fVar85 * fVar111 + fVar77 * fVar107) ^
                              uVar50);
          fStack_91c = (float)((uint)(fVar82 * fVar104 + fVar86 * fVar112 + fVar78 * fVar108) ^
                              uVar53);
          local_918 = (float)((uint)(fVar98 * fVar87 + fVar109 * fVar93 + fVar105 * fVar97) ^ uVar44
                             );
          fStack_914 = (float)((uint)(fVar100 * fVar88 + fVar110 * fVar94 + fVar106 * fVar99) ^
                              uVar47);
          fStack_910 = (float)((uint)(fVar102 * fVar89 + fVar111 * fVar95 + fVar107 * fVar101) ^
                              uVar50);
          fStack_90c = (float)((uint)(fVar104 * fVar90 + fVar112 * fVar96 + fVar108 * fVar103) ^
                              uVar53);
          local_8f8 = ABS(fVar39);
          fStack_8f4 = ABS(fVar91);
          fStack_8f0 = ABS(fVar92);
          fStack_8ec = ABS(fVar43);
          bVar23 = ((0.0 <= local_918 && 0.0 <= local_928) && fVar39 != 0.0) &&
                   local_928 + local_918 <= local_8f8;
          bVar24 = ((0.0 <= fStack_914 && 0.0 <= fStack_924) && fVar91 != 0.0) &&
                   fStack_924 + fStack_914 <= fStack_8f4;
          bVar22 = ((0.0 <= fStack_910 && 0.0 <= fStack_920) && fVar92 != 0.0) &&
                   fStack_920 + fStack_910 <= fStack_8f0;
          bVar38 = ((0.0 <= fStack_90c && 0.0 <= fStack_91c) && fVar43 != 0.0) &&
                   fStack_91c + fStack_90c <= fStack_8ec;
          auVar21._4_4_ = -(uint)bVar24;
          auVar21._0_4_ = -(uint)bVar23;
          auVar21._8_4_ = -(uint)bVar22;
          auVar21._12_4_ = -(uint)bVar38;
          iVar26 = movmskps((int)lVar27,auVar21);
          if (iVar26 != 0) {
            local_908 = (float)(uVar44 ^ (uint)(fVar52 * local_898[0] +
                                               fVar57 * local_888[0] + fVar61 * local_878[0]));
            fStack_904 = (float)(uVar47 ^ (uint)(fVar65 * local_898[1] +
                                                fVar60 * local_888[1] + fVar45 * local_878[1]));
            fStack_900 = (float)(uVar50 ^ (uint)(fVar72 * local_898[2] +
                                                fVar64 * local_888[2] + fVar48 * local_878[2]));
            fStack_8fc = (float)(uVar53 ^ (uint)(fVar74 * local_898[3] +
                                                fVar68 * local_888[3] + fVar51 * local_878[3]));
            fVar39 = *(float *)(ray + k * 4 + 0x30);
            fVar43 = *(float *)(ray + k * 4 + 0x80);
            local_8d8._0_4_ =
                 -(uint)((local_908 <= fVar43 * local_8f8 && fVar39 * local_8f8 < local_908) &&
                        bVar23);
            local_8d8._4_4_ =
                 -(uint)((fStack_904 <= fVar43 * fStack_8f4 && fVar39 * fStack_8f4 < fStack_904) &&
                        bVar24);
            local_8d8._8_4_ =
                 -(uint)((fStack_900 <= fVar43 * fStack_8f0 && fVar39 * fStack_8f0 < fStack_900) &&
                        bVar22);
            local_8d8._12_4_ =
                 -(uint)((fStack_8fc <= fVar43 * fStack_8ec && fVar39 * fStack_8ec < fStack_8fc) &&
                        bVar38);
            uVar40 = movmskps(uVar40,local_8d8);
            uVar29 = (ulong)uVar40;
            if (uVar40 != 0) {
              auVar20._4_4_ = fStack_8f4;
              auVar20._0_4_ = local_8f8;
              auVar20._8_4_ = fStack_8f0;
              auVar20._12_4_ = fStack_8ec;
              auVar41 = rcpps(local_8d8,auVar20);
              fVar39 = auVar41._0_4_;
              fVar43 = auVar41._4_4_;
              fVar46 = auVar41._8_4_;
              fVar49 = auVar41._12_4_;
              fVar39 = (1.0 - local_8f8 * fVar39) * fVar39 + fVar39;
              fVar43 = (1.0 - fStack_8f4 * fVar43) * fVar43 + fVar43;
              fVar46 = (1.0 - fStack_8f0 * fVar46) * fVar46 + fVar46;
              fVar49 = (1.0 - fStack_8ec * fVar49) * fVar49 + fVar49;
              local_8a8[0] = local_908 * fVar39;
              local_8a8[1] = fStack_904 * fVar43;
              local_8a8[2] = fStack_900 * fVar46;
              local_8a8[3] = fStack_8fc * fVar49;
              local_8c8._0_4_ = local_928 * fVar39;
              local_8c8._4_4_ = fStack_924 * fVar43;
              local_8c8._8_4_ = fStack_920 * fVar46;
              local_8c8._12_4_ = fStack_91c * fVar49;
              local_8b8._0_4_ = fVar39 * local_918;
              local_8b8._4_4_ = fVar43 * fStack_914;
              local_8b8._8_4_ = fVar46 * fStack_910;
              local_8b8._12_4_ = fVar49 * fStack_90c;
              do {
                local_9b0 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> local_9b0 & 1) == 0; local_9b0 = local_9b0 + 1) {
                  }
                }
                local_808 = *(uint *)((long)&local_938 + local_9b0 * 4);
                local_9b8 = (local_9a8->geometries).items[local_808].ptr;
                if ((local_9b8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar29 = uVar29 ^ 1L << (local_9b0 & 0x3f);
                  bVar38 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (local_9b8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar38 = false;
                }
                else {
                  uVar25 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_838 = *(undefined4 *)(local_8c8 + local_9b0 * 4);
                  fVar39 = local_8a8[local_9b0 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8a8[local_9b0];
                  args.context = context->user;
                  local_818 = *(undefined4 *)((long)&local_948 + local_9b0 * 4);
                  local_828._4_4_ = fVar39;
                  local_828._0_4_ = fVar39;
                  local_828._8_4_ = fVar39;
                  local_828._12_4_ = fVar39;
                  local_868 = local_898[local_9b0];
                  local_858 = local_888[local_9b0];
                  local_848 = local_878[local_9b0];
                  fStack_864 = local_868;
                  fStack_860 = local_868;
                  fStack_85c = local_868;
                  fStack_854 = local_858;
                  fStack_850 = local_858;
                  fStack_84c = local_858;
                  fStack_844 = local_848;
                  fStack_840 = local_848;
                  fStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_814 = local_818;
                  uStack_810 = local_818;
                  uStack_80c = local_818;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_9c8 = *local_990;
                  args.valid = (int *)local_9c8;
                  args.geometryUserPtr = local_9b8->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  pRVar28 = (RTCRayN *)local_9b8->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar28 != (RTCRayN *)0x0) {
                    pRVar28 = (RTCRayN *)(*(code *)pRVar28)(&args);
                  }
                  if (local_9c8 == (undefined1  [16])0x0) {
                    auVar55._8_4_ = 0xffffffff;
                    auVar55._0_8_ = 0xffffffffffffffff;
                    auVar55._12_4_ = 0xffffffff;
                    auVar55 = auVar55 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_9b8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var19)(&args);
                    }
                    auVar42._0_4_ = -(uint)(local_9c8._0_4_ == 0);
                    auVar42._4_4_ = -(uint)(local_9c8._4_4_ == 0);
                    auVar42._8_4_ = -(uint)(local_9c8._8_4_ == 0);
                    auVar42._12_4_ = -(uint)(local_9c8._12_4_ == 0);
                    auVar55 = auVar42 ^ _DAT_01febe20;
                    auVar41 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar42
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar41;
                    pRVar28 = args.ray;
                  }
                  auVar56._0_4_ = auVar55._0_4_ << 0x1f;
                  auVar56._4_4_ = auVar55._4_4_ << 0x1f;
                  auVar56._8_4_ = auVar55._8_4_ << 0x1f;
                  auVar56._12_4_ = auVar55._12_4_ << 0x1f;
                  iVar26 = movmskps((int)pRVar28,auVar56);
                  bVar38 = iVar26 == 0;
                  if (bVar38) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar25;
                    uVar29 = uVar29 ^ 1L << (local_9b0 & 0x3f);
                  }
                }
                if (!bVar38) {
                  pNStack_a90 = (NodeRef *)0x0;
                  if (bVar37) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    pNStack_a90 = (NodeRef *)0x1;
                  }
                  goto LAB_0026ac14;
                }
              } while (uVar29 != 0);
            }
          }
          uVar30 = uVar30 + 1;
          bVar37 = uVar30 < local_980;
        } while (uVar30 != local_980);
        pNStack_a90 = (NodeRef *)0x0;
      }
    }
LAB_0026ac14:
  } while (((ulong)pNStack_a90 & 3) == 0);
  return local_988 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }